

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O1

void __thiscall QPDF::insertPage(QPDF *this,QPDFObjectHandle *newpage,int pos)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  long lVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  QPDFObjectHandle *this_00;
  bool bVar6;
  int iVar7;
  QPDF *pQVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  runtime_error *this_01;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  unsigned_long i;
  ulong uVar13;
  type ii;
  QPDFObjectHandle pages;
  QPDFObjectHandle kids;
  QPDFObjGen og;
  string local_c8;
  QPDFObjectHandle *local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  ulong local_60;
  QPDFObjectHandle local_58;
  QPDFObjectHandle local_48;
  QPDFObjGen local_38;
  
  uVar13 = (ulong)(uint)pos;
  flattenPagesTree(this);
  bVar6 = QPDFObjectHandle::isIndirect(newpage);
  local_a8 = newpage;
  if (bVar6) {
    pQVar8 = QPDFObjectHandle::getOwningQPDF(newpage);
    if (pQVar8 == this) goto LAB_0023e2f1;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    pQVar8 = QPDFObjectHandle::getQPDF(local_a8,&local_c8);
    pushInheritedAttributesToPage(pQVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_90._16_8_ =
         (local_a8->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_78 = (local_a8->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_78->_M_use_count = local_78->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_78->_M_use_count = local_78->_M_use_count + 1;
      }
    }
    copyForeignObject((QPDF *)&local_c8,(QPDFObjectHandle *)this);
    newpage = local_a8;
    sVar5 = local_c8._M_string_length;
    _Var4._M_p = local_c8._M_dataplus._M_p;
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    p_Var12 = (local_a8->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (local_a8->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)_Var4._M_p;
    (local_a8->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    p_Var12 = local_78;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
      p_Var12 = local_78;
    }
  }
  else {
    local_70 = (newpage->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68 = (newpage->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_68->_M_use_count = local_68->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_68->_M_use_count = local_68->_M_use_count + 1;
      }
    }
    makeIndirectObject((QPDF *)&local_c8,(QPDFObjectHandle *)this);
    sVar5 = local_c8._M_string_length;
    _Var4._M_p = local_c8._M_dataplus._M_p;
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    p_Var12 = (newpage->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (newpage->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)_Var4._M_p;
    (newpage->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    p_Var12 = local_68;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
      p_Var12 = local_68;
    }
  }
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
  }
LAB_0023e2f1:
  if ((-1 < pos) &&
     (_Var2._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl,
     i = (long)*(pointer *)((long)&(_Var2._M_head_impl)->all_pages + 8) -
         *(long *)&((_Var2._M_head_impl)->all_pages).
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> >> 4,
     uVar13 <= i)) {
    if ((pos != 0) && (i >> 0x1f != 0)) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    }
    local_38 = QPDFObjectHandle::getObjGen(newpage);
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    cVar9 = std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
            ::find(&((_Var2._M_head_impl)->pageobj_to_pages_pos)._M_t,&local_38);
    this_00 = local_a8;
    if (cVar9._M_node != (_Base_ptr)((long)&(_Var2._M_head_impl)->pageobj_to_pages_pos + 8U)) {
      local_a0._0_8_ =
           (local_a8->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_a0._8_8_ =
           (local_a8->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count + 1;
        }
      }
      QPDFObjectHandle::shallowCopy(&local_48);
      makeIndirectObject((QPDF *)&local_c8,(QPDFObjectHandle *)this);
      sVar5 = local_c8._M_string_length;
      _Var4._M_p = local_c8._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      p_Var12 = (this_00->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this_00->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var4._M_p;
      (this_00->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
      }
      if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
      }
    }
    getRoot((QPDF *)(local_a0 + 0x10));
    paVar1 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Pages","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_a0,(string *)(local_a0 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Kids","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_a0 + 0x10),(string *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Parent","");
    QPDFObjectHandle::replaceKey(this_00,&local_c8,(QPDFObjectHandle *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    QPDFObjectHandle::insertItem((QPDFObjectHandle *)(local_a0 + 0x10),pos,this_00);
    iVar7 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)(local_a0 + 0x10));
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Count","");
    QPDFObjectHandle::newInteger(&local_58,(long)iVar7);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_a0,&local_c8,&local_58);
    if (local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::insert
              (&(_Var2._M_head_impl)->all_pages,
               (QPDFObjectHandle *)
               (uVar13 * 0x10 +
               *(long *)&((_Var2._M_head_impl)->all_pages).
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>),
               this_00);
    local_60 = uVar13;
    if ((int)(pos + 1U) < iVar7) {
      uVar13 = (ulong)(pos + 1U);
      lVar11 = uVar13 << 4;
      do {
        _Var2._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        lVar3 = *(long *)&((_Var2._M_head_impl)->all_pages).
                          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>;
        if ((ulong)((long)*(pointer *)((long)&(_Var2._M_head_impl)->all_pages + 8) - lVar3 >> 4) <=
            uVar13) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar13);
        }
        local_c8._M_dataplus._M_p =
             (pointer)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)(lVar3 + lVar11));
        pmVar10 = std::
                  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                  ::operator[](&((this->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                pageobj_to_pages_pos,(key_type *)&local_c8);
        *pmVar10 = (mapped_type)uVar13;
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 0x10;
      } while ((int)uVar13 < iVar7);
    }
    insertPageobjToPage(this,local_a8,(int)local_60,true);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"QPDF::insertPage called with pos out of range");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDF::insertPage(QPDFObjectHandle newpage, int pos)
{
    // pos is numbered from 0, so pos = 0 inserts at the beginning and pos = npages adds to the end.

    flattenPagesTree();

    if (!newpage.isIndirect()) {
        QTC::TC("qpdf", "QPDF insert non-indirect page");
        newpage = makeIndirectObject(newpage);
    } else if (newpage.getOwningQPDF() != this) {
        QTC::TC("qpdf", "QPDF insert foreign page");
        newpage.getQPDF().pushInheritedAttributesToPage();
        newpage = copyForeignObject(newpage);
    } else {
        QTC::TC("qpdf", "QPDF insert indirect page");
    }

    if ((pos < 0) || (toS(pos) > m->all_pages.size())) {
        throw std::runtime_error("QPDF::insertPage called with pos out of range");
    }

    QTC::TC(
        "qpdf",
        "QPDF insert page",
        (pos == 0) ? 0 :                            // insert at beginning
            (pos == toI(m->all_pages.size())) ? 1   // at end
                                              : 2); // insert in middle

    auto og = newpage.getObjGen();
    if (m->pageobj_to_pages_pos.count(og)) {
        QTC::TC("qpdf", "QPDF resolve duplicated page in insert");
        newpage = makeIndirectObject(QPDFObjectHandle(newpage).shallowCopy());
    }

    QPDFObjectHandle pages = getRoot().getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");

    newpage.replaceKey("/Parent", pages);
    kids.insertItem(pos, newpage);
    int npages = kids.getArrayNItems();
    pages.replaceKey("/Count", QPDFObjectHandle::newInteger(npages));
    m->all_pages.insert(m->all_pages.begin() + pos, newpage);
    for (int i = pos + 1; i < npages; ++i) {
        insertPageobjToPage(m->all_pages.at(toS(i)), i, false);
    }
    insertPageobjToPage(newpage, pos, true);
}